

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O1

int onig_get_capture_range_in_callout(OnigCalloutArgs *a,int mem_num,int *begin,int *end)

{
  OnigRegex pOVar1;
  StackType *pSVar2;
  StkPtrType *pSVar3;
  int iVar4;
  uint uVar5;
  StkPtrType *pSVar6;
  
  if (0 < mem_num) {
    if (a->mem_end_stk[(uint)mem_num].i == -1) {
      *end = -1;
      *begin = -1;
    }
    else {
      pOVar1 = a->regex;
      pSVar2 = a->stk_base;
      uVar5 = 1 << ((byte)mem_num & 0x1f);
      if (0x1f < mem_num) {
        uVar5 = 1;
      }
      pSVar6 = a->mem_start_stk + (uint)mem_num;
      if ((pOVar1->push_mem_start & uVar5) != 0) {
        pSVar6 = (StkPtrType *)&pSVar2[pSVar6->i].u;
      }
      pSVar3 = a->mem_end_stk + (uint)mem_num;
      uVar5 = 1 << ((byte)mem_num & 0x1f);
      iVar4 = (int)a->string;
      *begin = *(int *)pSVar6 - iVar4;
      if (0x1f < mem_num) {
        uVar5 = 1;
      }
      if ((pOVar1->push_mem_end & uVar5) != 0) {
        pSVar3 = (StkPtrType *)&pSVar2[pSVar3->i].u;
      }
      *end = *(int *)pSVar3 - iVar4;
    }
    return 0;
  }
  return -0x1e;
}

Assistant:

extern int
onig_get_capture_range_in_callout(OnigCalloutArgs* a, int mem_num, int* begin, int* end)
{
  OnigRegex    reg;
  const UChar* str;
  StackType*   stk_base;
  int i;
  StkPtrType* mem_start_stk;
  StkPtrType* mem_end_stk;

  i = mem_num;
  reg = a->regex;
  str = a->string;
  stk_base = a->stk_base;
  mem_start_stk = a->mem_start_stk;
  mem_end_stk   = a->mem_end_stk;

  if (i > 0) {
    if (a->mem_end_stk[i].i != INVALID_STACK_INDEX) {
      *begin = (int )(STACK_MEM_START(reg, i) - str);
      *end   = (int )(STACK_MEM_END(reg, i)   - str);
    }
    else {
      *begin = *end = ONIG_REGION_NOTPOS;
    }
  }
  else
    return ONIGERR_INVALID_ARGUMENT;

  return ONIG_NORMAL;
}